

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

VkClearValue vkt::anon_unknown_0::randomClearValue(Attachment *attachment,Random *rng)

{
  bool bVar1;
  TextureFormat TVar2;
  ulong uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  ChannelOrder order;
  ulong uVar5;
  VkClearColorValue VVar6;
  VkClearValue VVar7;
  
  TVar2 = ::vk::mapVkFormat(attachment->m_format);
  order = TVar2.order;
  bVar1 = tcu::hasStencilComponent(order);
  if ((bVar1) || (bVar1 = tcu::hasDepthComponent(order), bVar1)) {
    bVar1 = tcu::hasStencilComponent(order);
    if (bVar1) {
      bVar1 = de::Random::getBool(rng);
      uVar5 = 0xff00000000;
      if (!bVar1) {
        uVar5 = 0;
      }
    }
    else {
      uVar5 = 0xcd00000000;
    }
    bVar1 = tcu::hasDepthComponent(order);
    if (bVar1) {
      bVar1 = de::Random::getBool(rng);
      uVar3 = 0x3f800000;
      uVar4 = extraout_RDX_00;
      if (!bVar1) {
        uVar3 = 0;
      }
    }
    else {
      uVar3 = 0x7fffffff;
      uVar4 = extraout_RDX;
    }
  }
  else {
    VVar6 = randomColorClearValue(attachment,rng);
    uVar4 = VVar6._8_8_;
    uVar5 = VVar6._0_8_ & 0xffffffff00000000;
    uVar3 = (ulong)VVar6.uint32[0];
  }
  VVar7._0_8_ = uVar3 | uVar5;
  VVar7._8_8_ = uVar4;
  return VVar7;
}

Assistant:

VkClearValue randomClearValue (const Attachment& attachment, de::Random& rng)
{
	const float					clearNan	= tcu::Float32::nan().asFloat();
	const tcu::TextureFormat	format		= mapVkFormat(attachment.getFormat());

	if (tcu::hasStencilComponent(format.order) || tcu::hasDepthComponent(format.order))
	{
		VkClearValue clearValue;

		clearValue.depthStencil.depth	= clearNan;
		clearValue.depthStencil.stencil	= 0xCDu;

		if (tcu::hasStencilComponent(format.order))
			clearValue.depthStencil.stencil	= rng.getBool()
											? 0xFFu
											: 0x0u;

		if (tcu::hasDepthComponent(format.order))
			clearValue.depthStencil.depth	= rng.getBool()
											? 1.0f
											: 0.0f;

		return clearValue;
	}
	else
	{
		VkClearValue clearValue;

		clearValue.color = randomColorClearValue(attachment, rng);

		return clearValue;
	}
}